

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adapt.c
# Opt level: O2

REF_STATUS ref_adapt_tattle(REF_GRID ref_grid,char *mode)

{
  REF_NODE pRVar1;
  REF_CELL pRVar2;
  REF_ADAPT pRVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  REF_STATUS RVar8;
  uint uVar9;
  long lVar10;
  undefined8 uVar11;
  char *pcVar12;
  int iVar13;
  REF_MPI ref_mpi;
  double local_120;
  REF_INT nnode;
  REF_MPI local_110;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  REF_DBL min_normdev;
  REF_DBL min_quality;
  double local_e8;
  REF_DBL ratio;
  REF_DBL quality;
  REF_INT part;
  REF_EDGE ref_edge;
  REF_DBL normdev;
  char *local_b8;
  REF_DBL delta;
  REF_INT nodes [27];
  
  if (ref_grid->twod == 0) {
    lVar10 = 0x28;
    if (ref_grid->surf == 0) {
      lVar10 = 0x50;
    }
  }
  else {
    lVar10 = 0x28;
  }
  local_110 = ref_grid->mpi;
  pRVar1 = ref_grid->node;
  pRVar2 = *(REF_CELL *)((long)ref_grid->cell + lVar10 + -0x10);
  min_quality = 1.0;
  local_b8 = mode;
  for (iVar13 = 0; ref_mpi = local_110, iVar13 < pRVar2->max; iVar13 = iVar13 + 1) {
    RVar8 = ref_cell_nodes(pRVar2,iVar13,nodes);
    if (RVar8 == 0) {
      if (ref_grid->twod == 0) {
        if (ref_grid->surf == 0) {
          uVar9 = ref_node_tet_quality(ref_grid->node,nodes,&quality);
          if (uVar9 != 0) {
            pcVar12 = "qual";
            uVar11 = 0x192;
            goto LAB_00174af8;
          }
        }
        else {
          uVar9 = ref_node_tri_quality(ref_grid->node,nodes,&quality);
          if (uVar9 != 0) {
            pcVar12 = "qual";
            uVar11 = 399;
            goto LAB_00174af8;
          }
        }
      }
      else {
        uVar9 = ref_node_tri_quality(ref_grid->node,nodes,&quality);
        if (uVar9 != 0) {
          pcVar12 = "qual";
          uVar11 = 0x18c;
          goto LAB_00174af8;
        }
      }
      if (quality <= min_quality) {
        min_quality = quality;
      }
    }
  }
  quality = min_quality;
  uVar9 = ref_mpi_min(local_110,&quality,&min_quality,3);
  if (uVar9 == 0) {
    uVar9 = ref_mpi_bcast(ref_mpi,&quality,1,3);
    if (uVar9 == 0) {
      nnode = 0;
      iVar13 = 0;
      for (lVar10 = 0; lVar10 < pRVar1->max; lVar10 = lVar10 + 1) {
        if ((-1 < pRVar1->global[lVar10]) && (pRVar1->ref_mpi->id == pRVar1->part[lVar10])) {
          iVar13 = iVar13 + 1;
          nnode = iVar13;
        }
      }
      uVar9 = ref_mpi_allsum(ref_mpi,&nnode,1,1);
      if (uVar9 == 0) {
        min_normdev = 2.0;
        if ((ref_grid->geom->model == (void *)0x0) && (ref_grid->geom->meshlink == (void *)0x0)) {
          local_120 = 2.0;
        }
        else {
          pRVar2 = ref_grid->cell[3];
          local_120 = 2.0;
          for (iVar13 = 0; ref_mpi = local_110, iVar13 < pRVar2->max; iVar13 = iVar13 + 1) {
            RVar8 = ref_cell_nodes(pRVar2,iVar13,nodes);
            if (RVar8 == 0) {
              uVar9 = ref_geom_tri_norm_deviation(ref_grid,nodes,&normdev);
              if (uVar9 != 0) {
                pcVar12 = "norm dev";
                uVar11 = 0x1a7;
                goto LAB_00174af8;
              }
              min_normdev = local_120;
              if (normdev <= local_120) {
                local_120 = normdev;
                min_normdev = normdev;
              }
            }
          }
        }
        normdev = local_120;
        uVar9 = ref_mpi_min(ref_mpi,&normdev,&min_normdev,3);
        if (uVar9 == 0) {
          uVar9 = ref_mpi_bcast(ref_mpi,&min_normdev,1,3);
          if (uVar9 == 0) {
            min_ratio = 1e+200;
            max_ratio = -1e+200;
            uVar9 = ref_edge_create(&ref_edge,ref_grid);
            if (uVar9 == 0) {
              local_120 = 1e+200;
              local_e8 = -1e+200;
              for (lVar10 = 0; lVar10 < ref_edge->n; lVar10 = lVar10 + 1) {
                uVar9 = ref_edge_part(ref_edge,(REF_INT)lVar10,&part);
                if (uVar9 != 0) {
                  pcVar12 = "edge part";
                  uVar11 = 0x1b3;
                  goto LAB_00174af8;
                }
                if (part == ref_grid->mpi->id) {
                  uVar9 = ref_node_ratio(ref_grid->node,ref_edge->e2n[lVar10 * 2],
                                         ref_edge->e2n[lVar10 * 2 + 1],&ratio);
                  if (uVar9 != 0) {
                    pcVar12 = "rat";
                    uVar11 = 0x1b8;
                    goto LAB_00174af8;
                  }
                  if (ratio <= local_120) {
                    local_120 = ratio;
                  }
                  max_ratio = local_e8;
                  min_ratio = local_120;
                  if (local_e8 <= ratio) {
                    max_ratio = ratio;
                    local_e8 = ratio;
                  }
                }
              }
              uVar9 = ref_edge_free(ref_edge);
              if (uVar9 == 0) {
                ratio = local_120;
                uVar9 = ref_mpi_min(ref_mpi,&ratio,&min_ratio,3);
                if (uVar9 == 0) {
                  uVar9 = ref_mpi_bcast(ref_mpi,&min_ratio,1,3);
                  if (uVar9 == 0) {
                    ratio = local_e8;
                    uVar9 = ref_mpi_max(ref_mpi,&ratio,&max_ratio,3);
                    if (uVar9 == 0) {
                      uVar9 = ref_mpi_bcast(local_110,&max_ratio,1,3);
                      if (uVar9 == 0) {
                        uVar9 = ref_mpi_stopwatch_delta(local_110,&delta);
                        if (uVar9 == 0) {
                          if (ref_grid->mpi->id != 0) {
                            return 0;
                          }
                          pRVar3 = ref_grid->adapt;
                          uVar11 = 0x2a;
                          uVar4 = 0x20;
                          uVar5 = uVar4;
                          if (min_quality < pRVar3->smooth_min_quality) {
                            uVar5 = uVar11;
                          }
                          uVar6 = uVar4;
                          if (min_ratio < pRVar3->post_min_ratio) {
                            uVar6 = uVar11;
                          }
                          uVar7 = uVar4;
                          if (pRVar3->post_max_ratio <= max_ratio &&
                              max_ratio != pRVar3->post_max_ratio) {
                            uVar7 = uVar11;
                          }
                          if (min_normdev < pRVar3->post_min_normdev) {
                            uVar4 = uVar11;
                          }
                          printf("mr %c %6.4f ratio %c %6.4f %6.2f %c norm %6.4f %c %4.1f sec %5s n %d\n"
                                 ,uVar5,uVar6,uVar7,uVar4,local_b8,nnode);
                          return 0;
                        }
                        pcVar12 = "time delta";
                        uVar11 = 0x1c5;
                      }
                      else {
                        pcVar12 = "max";
                        uVar11 = 0x1c3;
                      }
                    }
                    else {
                      pcVar12 = "mpi max";
                      uVar11 = 0x1c2;
                    }
                  }
                  else {
                    pcVar12 = "min";
                    uVar11 = 0x1c0;
                  }
                }
                else {
                  pcVar12 = "mpi min";
                  uVar11 = 0x1bf;
                }
              }
              else {
                pcVar12 = "free edge";
                uVar11 = 0x1bd;
              }
            }
            else {
              pcVar12 = "make edges";
              uVar11 = 0x1b1;
            }
          }
          else {
            pcVar12 = "min";
            uVar11 = 0x1ad;
          }
        }
        else {
          pcVar12 = "mpi max";
          uVar11 = 0x1ac;
        }
      }
      else {
        pcVar12 = "int sum";
        uVar11 = 0x1a0;
      }
    }
    else {
      pcVar12 = "min";
      uVar11 = 0x198;
    }
  }
  else {
    pcVar12 = "min";
    uVar11 = 0x197;
  }
LAB_00174af8:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",uVar11,
         "ref_adapt_tattle",(ulong)uVar9,pcVar12);
  return uVar9;
}

Assistant:

REF_FCN static REF_STATUS ref_adapt_tattle(REF_GRID ref_grid,
                                           const char *mode) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL quality, min_quality;
  REF_DBL normdev, min_normdev;
  REF_INT node, nnode;
  REF_DBL ratio, min_ratio, max_ratio, delta;
  REF_INT edge, part;
  REF_EDGE ref_edge;
  char is_ok = ' ';
  char not_ok = '*';
  char quality_met, short_met, long_met, normdev_met;

  if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  min_quality = 1.0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_node_tri_quality(ref_grid_node(ref_grid), nodes, &quality),
          "qual");
    } else if (ref_grid_surf(ref_grid)) {
      RSS(ref_node_tri_quality(ref_grid_node(ref_grid), nodes, &quality),
          "qual");
    } else {
      RSS(ref_node_tet_quality(ref_grid_node(ref_grid), nodes, &quality),
          "qual");
    }
    min_quality = MIN(min_quality, quality);
  }
  quality = min_quality;
  RSS(ref_mpi_min(ref_mpi, &quality, &min_quality, REF_DBL_TYPE), "min");
  RSS(ref_mpi_bcast(ref_mpi, &quality, 1, REF_DBL_TYPE), "min");

  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      nnode++;
    }
  }
  RSS(ref_mpi_allsum(ref_mpi, &nnode, 1, REF_INT_TYPE), "int sum");

  min_normdev = 2.0;
  if (ref_geom_model_loaded(ref_grid_geom(ref_grid)) ||
      ref_geom_meshlinked(ref_grid_geom(ref_grid))) {
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "norm dev");
      min_normdev = MIN(min_normdev, normdev);
    }
  }
  normdev = min_normdev;
  RSS(ref_mpi_min(ref_mpi, &normdev, &min_normdev, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &min_normdev, 1, REF_DBL_TYPE), "min");

  min_ratio = REF_DBL_MAX;
  max_ratio = REF_DBL_MIN;
  RSS(ref_edge_create(&ref_edge, ref_grid), "make edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part == ref_mpi_rank(ref_grid_mpi(ref_grid))) {
      RSS(ref_node_ratio(ref_grid_node(ref_grid),
                         ref_edge_e2n(ref_edge, 0, edge),
                         ref_edge_e2n(ref_edge, 1, edge), &ratio),
          "rat");
      min_ratio = MIN(min_ratio, ratio);
      max_ratio = MAX(max_ratio, ratio);
    }
  }
  RSS(ref_edge_free(ref_edge), "free edge");
  ratio = min_ratio;
  RSS(ref_mpi_min(ref_mpi, &ratio, &min_ratio, REF_DBL_TYPE), "mpi min");
  RSS(ref_mpi_bcast(ref_mpi, &min_ratio, 1, REF_DBL_TYPE), "min");
  ratio = max_ratio;
  RSS(ref_mpi_max(ref_mpi, &ratio, &max_ratio, REF_DBL_TYPE), "mpi max");
  RSS(ref_mpi_bcast(ref_mpi, &max_ratio, 1, REF_DBL_TYPE), "max");

  RSS(ref_mpi_stopwatch_delta(ref_mpi, &delta), "time delta");

  if (ref_grid_once(ref_grid)) {
    quality_met = is_ok;
    short_met = is_ok;
    long_met = is_ok;
    normdev_met = is_ok;
    if (min_quality < ref_grid_adapt(ref_grid, smooth_min_quality))
      quality_met = not_ok;
    if (min_ratio < ref_grid_adapt(ref_grid, post_min_ratio))
      short_met = not_ok;
    if (max_ratio > ref_grid_adapt(ref_grid, post_max_ratio)) long_met = not_ok;
    if (min_normdev < ref_grid_adapt(ref_grid, post_min_normdev))
      normdev_met = not_ok;

    printf(
        "mr %c %6.4f ratio %c %6.4f %6.2f %c norm %6.4f %c %4.1f sec "
        "%5s n %d\n",
        quality_met, min_quality, short_met, min_ratio, max_ratio, long_met,
        min_normdev, normdev_met, delta, mode, nnode);
  }

  return REF_SUCCESS;
}